

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.cpp
# Opt level: O0

int main(void)

{
  UnitTest local_d;
  undefined4 local_c;
  UnitTest test;
  
  local_c = 0;
  unittest::UnitTest::TestParseGenerate1(&local_d);
  unittest::UnitTest::TestParseGenerate1W(&local_d);
  unittest::UnitTest::TestParseGenerate2(&local_d);
  unittest::UnitTest::TestParseGenerate2W(&local_d);
  unittest::UnitTest::TestParseGenerate3(&local_d);
  unittest::UnitTest::TestParseGenerate4(&local_d);
  unittest::UnitTest::TestInfiniteRecursion1(&local_d);
  unittest::UnitTest::TestInfiniteRecursion2(&local_d);
  unittest::UnitTest::TestInfiniteRecursion3(&local_d);
  unittest::UnitTest::TestInterpolate1(&local_d);
  unittest::UnitTest::TestExtract(&local_d);
  unittest::UnitTest::TestDefault(&local_d);
  unittest::UnitTest::TestHashComment1(&local_d);
  unittest::UnitTest::TestHashComment2(&local_d);
  unittest::UnitTest::TestMixedComment(&local_d);
  unittest::UnitTest::TestGetValue(&local_d);
  unittest::UnitTest::TestTrailingComments(&local_d);
  return 0;
}

Assistant:

int main() {
	unittest::UnitTest test;
	test.TestParseGenerate1();
	test.TestParseGenerate1W();
	test.TestParseGenerate2();
	test.TestParseGenerate2W();
	test.TestParseGenerate3();
	test.TestParseGenerate4();
	test.TestInfiniteRecursion1();
	test.TestInfiniteRecursion2();
	test.TestInfiniteRecursion3();
	test.TestInterpolate1();
	test.TestExtract();
	test.TestDefault();
	test.TestHashComment1();
	test.TestHashComment2();
	test.TestMixedComment();
	test.TestGetValue();
	test.TestTrailingComments();
	return 0;
}